

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Cube::cubeSetup(Cube *this,float x,float y,float z,float l,float b,float h)

{
  this->x = x;
  this->y = y;
  this->z = z;
  this->l = l;
  this->b = b;
  this->h = h;
  setupFrontFace(this);
  setupBackFace(this);
  setupLeftFace(this);
  setupRightFace(this);
  setupTopFace(this);
  setupBottomFace(this);
  return;
}

Assistant:

void cubeSetup(float x,float y,float z,float l,float b,float h) {
        this->x=x;
        this->y=y;
        this->z=z;
        this->l=l;
        this->b=b;
        this->h=h;
        setupFrontFace();
        setupBackFace();
        setupLeftFace();
        setupRightFace();
        setupTopFace();
        setupBottomFace();
    }